

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O0

int cmd_setroot(char *args)

{
  int iVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *local_30;
  char *ptr;
  char *subdir;
  char *archive;
  char *args_local;
  
  if (*args == '\"') {
    subdir = args + 1;
    local_30 = strchr(subdir,0x22);
    if (local_30 == (char *)0x0) {
      printf("missing string terminator in argument.\n");
      return 1;
    }
    *local_30 = '\0';
  }
  else {
    local_30 = strchr(args,0x20);
    *local_30 = '\0';
    subdir = args;
  }
  ptr = local_30 + 1;
  if (*ptr == '\"') {
    ptr = local_30 + 2;
    pcVar2 = strchr(ptr,0x22);
    if (pcVar2 == (char *)0x0) {
      printf("missing string terminator in argument.\n");
      return 1;
    }
    *pcVar2 = '\0';
  }
  iVar1 = PHYSFS_setRoot(subdir,ptr);
  if (iVar1 == 0) {
    uVar3 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar3);
  }
  else {
    printf("Successful.\n");
  }
  return 1;
}

Assistant:

static int cmd_setroot(char *args)
{
    char *archive;
    char *subdir;
    char *ptr;

    archive = args;
    if (*archive == '\"')
    {
        archive++;
        ptr = strchr(archive, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */
    else
    {
        ptr = strchr(archive, ' ');
        *ptr = '\0';
    } /* else */

    subdir = ptr + 1;
    if (*subdir == '\"')
    {
        subdir++;
        ptr = strchr(subdir, '\"');
        if (ptr == NULL)
        {
            printf("missing string terminator in argument.\n");
            return 1;
        } /* if */
        *(ptr) = '\0';
    } /* if */

    if (PHYSFS_setRoot(archive, subdir))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}